

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_batchcompute_release_job.cc
# Opt level: O0

int __thiscall
aliyun::BatchCompute::ReleaseJob
          (BatchCompute *this,BatchComputeReleaseJobRequestType *req,
          BatchComputeReleaseJobResponseType *response,BatchComputeErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  AliRoaRequest *pAVar5;
  ulong uVar6;
  Value *pVVar7;
  bool local_3ca;
  allocator<char> local_3c9;
  string local_3c8;
  byte local_3a2;
  allocator<char> local_3a1;
  string local_3a0;
  byte local_37a;
  allocator<char> local_379;
  string local_378;
  byte local_352;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  undefined1 local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  AliRoaRequest *local_240;
  AliRoaRequest *req_rpc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [8];
  string url;
  undefined1 local_1b0 [8];
  string secheme;
  Reader reader;
  undefined1 local_70 [8];
  Value val;
  int local_50;
  bool parse_success;
  int ret;
  int status_code;
  string str_response;
  BatchComputeErrorInfo *error_info_local;
  BatchComputeReleaseJobResponseType *response_local;
  BatchComputeReleaseJobRequestType *req_local;
  BatchCompute *this_local;
  
  str_response.field_2._8_8_ = error_info;
  std::__cxx11::string::string((string *)&ret);
  val.comments_._7_1_ = 0;
  Json::Value::Value((Value *)local_70,nullValue);
  Json::Reader::Reader((Reader *)((long)&secheme.field_2 + 8));
  pcVar3 = "http";
  if ((this->use_tls_ & 1U) != 0) {
    pcVar3 = "https";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,pcVar3,(allocator<char> *)(url.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(url.field_2._M_local_buf + 0xf));
  std::operator+(&local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 "://");
  std::operator+(&local_1f8,&local_218,this->host_);
  uVar4 = std::__cxx11::string::c_str();
  get_format_string_abi_cxx11_((string *)&req_rpc,"/jobs/%s",uVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 &local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&req_rpc);
  std::__cxx11::string::~string((string *)&req_rpc);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  pAVar5 = (AliRoaRequest *)operator_new(0x2c8);
  local_2d9 = 1;
  pcVar3 = this->version_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,pcVar3,&local_261);
  pcVar3 = this->appid_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,pcVar3,&local_289);
  pcVar3 = this->secret_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,pcVar3,&local_2b1);
  std::__cxx11::string::string((string *)&local_2d8,(string *)local_1d8);
  AliRoaRequest::AliRoaRequest(pAVar5,&local_260,&local_288,&local_2b0,&local_2d8);
  local_2d9 = 0;
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  local_240 = pAVar5;
  if ((((this->use_tls_ & 1U) == 0) && (this->proxy_host_ != (char *)0x0)) &&
     (*this->proxy_host_ != '\0')) {
    pcVar3 = this->proxy_host_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,pcVar3,&local_301);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)pAVar5,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
  }
  pAVar5 = local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"DELETE",&local_329);
  AliHttpRequest::setRequestMethod(&pAVar5->super_AliHttpRequest,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  iVar2 = (**(local_240->super_AliHttpRequest)._vptr_AliHttpRequest)();
  if (iVar2 == 0) {
    local_50 = AliHttpRequest::WaitResponseHeaderComplete(&local_240->super_AliHttpRequest);
    AliHttpRequest::ReadResponseBody(&local_240->super_AliHttpRequest,(string *)&ret);
    if ((0 < local_50) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
      val.comments_._7_1_ =
           Json::Reader::parse((Reader *)((long)&secheme.field_2 + 8),(string *)&ret,
                               (Value *)local_70,true);
    }
    if ((val.comments_._7_1_ & 1) == 0) {
      if (str_response.field_2._8_8_ != 0) {
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x20),"parse response failed");
      }
      local_50 = -1;
    }
    else {
      if ((local_50 != 200) && (str_response.field_2._8_8_ != 0)) {
        local_352 = 0;
        bVar1 = Json::Value::isMember((Value *)local_70,"RequestId");
        if (bVar1) {
          pVVar7 = Json::Value::operator[]((Value *)local_70,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_350,pVVar7);
        }
        else {
          std::allocator<char>::allocator();
          local_352 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,anon_var_dwarf_ac4ec + 9,&local_351);
        }
        std::__cxx11::string::operator=((string *)str_response.field_2._8_8_,(string *)&local_350);
        std::__cxx11::string::~string((string *)&local_350);
        if ((local_352 & 1) != 0) {
          std::allocator<char>::~allocator(&local_351);
        }
        local_37a = 0;
        bVar1 = Json::Value::isMember((Value *)local_70,"Code");
        if (bVar1) {
          pVVar7 = Json::Value::operator[]((Value *)local_70,"Code");
          Json::Value::asString_abi_cxx11_(&local_378,pVVar7);
        }
        else {
          std::allocator<char>::allocator();
          local_37a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_378,anon_var_dwarf_ac4ec + 9,&local_379);
        }
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x20),(string *)&local_378);
        std::__cxx11::string::~string((string *)&local_378);
        if ((local_37a & 1) != 0) {
          std::allocator<char>::~allocator(&local_379);
        }
        local_3a2 = 0;
        bVar1 = Json::Value::isMember((Value *)local_70,"HostId");
        if (bVar1) {
          pVVar7 = Json::Value::operator[]((Value *)local_70,"HostId");
          Json::Value::asString_abi_cxx11_(&local_3a0,pVVar7);
        }
        else {
          std::allocator<char>::allocator();
          local_3a2 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a0,anon_var_dwarf_ac4ec + 9,&local_3a1);
        }
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x60),(string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
        if ((local_3a2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_3a1);
        }
        local_3ca = Json::Value::isMember((Value *)local_70,"Message");
        if (local_3ca) {
          pVVar7 = Json::Value::operator[]((Value *)local_70,"Message");
          Json::Value::asString_abi_cxx11_(&local_3c8,pVVar7);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c8,anon_var_dwarf_ac4ec + 9,&local_3c9);
        }
        local_3ca = !local_3ca;
        std::__cxx11::string::operator=
                  ((string *)(str_response.field_2._8_8_ + 0x40),(string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_3c8);
        if (local_3ca) {
          std::allocator<char>::~allocator(&local_3c9);
        }
      }
      if ((local_50 == 200) && (response != (BatchComputeReleaseJobResponseType *)0x0)) {
        anon_unknown.dwarf_4b41d::Json2Type((Value *)local_70,response);
      }
    }
  }
  else {
    if (str_response.field_2._8_8_ != 0) {
      std::__cxx11::string::operator=
                ((string *)(str_response.field_2._8_8_ + 0x20),"connect to host failed");
    }
    local_50 = -1;
  }
  pAVar5 = local_240;
  if (local_240 != (AliRoaRequest *)0x0) {
    AliRoaRequest::~AliRoaRequest(local_240);
    operator_delete(pAVar5,0x2c8);
  }
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)local_1b0);
  Json::Reader::~Reader((Reader *)((long)&secheme.field_2 + 8));
  Json::Value::~Value((Value *)local_70);
  std::__cxx11::string::~string((string *)&ret);
  return local_50;
}

Assistant:

int BatchCompute::ReleaseJob(const BatchComputeReleaseJobRequestType& req,
                      BatchComputeReleaseJobResponseType* response,
                      BatchComputeErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  Json::Value val;
  Json::Reader reader;
  std::string secheme = this->use_tls_ ? "https" : "http";
  std::string url = secheme  + "://" + host_ + get_format_string("/jobs/%s", req.resource_name.c_str());
  AliRoaRequest* req_rpc = new AliRoaRequest(version_,
                         appid_,
                         secret_,
                         url);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  req_rpc->setRequestMethod("DELETE");
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}